

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O2

_Bool cdns_validate_cfg(void)

{
  char *pcVar1;
  short sVar2;
  long lVar3;
  server_info *psVar4;
  int iVar5;
  _Bool _Var6;
  long lVar7;
  ulong uVar8;
  int len;
  in6_addr addr;
  
  iVar5 = evutil_inet_pton(2,g_cdns_cfg.local_ip,&addr);
  _Var6 = true;
  if (iVar5 != 1) {
    iVar5 = evutil_inet_pton(10,g_cdns_cfg.local_ip,&addr);
    if (iVar5 != 1) {
      _Var6 = false;
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0xbd,
                 "cdns_validate_cfg",0,3,"Invalid IP specified for listening address");
    }
  }
  if (g_cdns_cfg.local_port == 0) {
    g_cdns_cfg.local_port = 0x35;
  }
  if (g_cdns_cfg.timeout == 0) {
    g_cdns_cfg.timeout = 4;
  }
  if (g_svr_count == 0) {
    _Var6 = false;
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",199,
               "cdns_validate_cfg",0,3,"No upstream DNS server specified");
  }
  lVar7 = 0x10;
  for (uVar8 = 0; psVar4 = g_svr_cfg, uVar8 < g_svr_count; uVar8 = uVar8 + 1) {
    lVar3 = *(long *)((g_svr_cfg->addr).__ss_padding + lVar7 + -0x22);
    if (lVar3 == 0) {
      _Var6 = false;
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0xd8,
                 "cdns_validate_cfg",0,3,"IP:port pair is required");
    }
    else {
      len = 0x80;
      iVar5 = evutil_parse_sockaddr_port(lVar3,(g_svr_cfg->addr).__ss_padding + lVar7 + -0x12,&len);
      if (iVar5 != 0) {
        _Var6 = false;
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                   0xcf,"cdns_validate_cfg",0,3,"Invalid IP:port pair for upstream DNS server: %s",
                   *(undefined8 *)((g_svr_cfg->addr).__ss_padding + lVar7 + -0x22));
      }
      sVar2 = *(short *)((g_svr_cfg->addr).__ss_padding + lVar7 + -0x12);
      if (((sVar2 == 10) || (sVar2 == 2)) &&
         (*(short *)((psVar4->addr).__ss_padding + lVar7 + -0x10) == 0)) {
        pcVar1 = (psVar4->addr).__ss_padding + lVar7 + -0x10;
        pcVar1[0] = '\0';
        pcVar1[1] = '5';
      }
    }
    lVar7 = lVar7 + 0xe8;
  }
  return _Var6;
}

Assistant:

bool cdns_validate_cfg()
{
    bool rc = true;
    unsigned int i;
    struct in6_addr addr;
    int len;

    if (evutil_inet_pton(AF_INET, g_cdns_cfg.local_ip, &addr) != 1
        && evutil_inet_pton(AF_INET6, g_cdns_cfg.local_ip, &addr) != 1) {
        log_error(LOG_ERR, "Invalid IP specified for listening address");
        rc = false;
    }
    if (g_cdns_cfg.local_port == 0)
        g_cdns_cfg.local_port = DNS_DEFAULT_PORT;
    if (g_cdns_cfg.timeout == 0)
        g_cdns_cfg.timeout = DEFAULT_TIMEOUT_SECONDS;

    // Validate servers
    if (g_svr_count == 0) {
        log_error(LOG_ERR, "No upstream DNS server specified");
        rc = false;
    }
    for (i = 0; i < g_svr_count; i++) {
        if (g_svr_cfg[i].ip_port) {
            struct sockaddr * addr = (struct sockaddr*)&g_svr_cfg[i].addr;
            len = sizeof(g_svr_cfg[i].addr);
            if (evutil_parse_sockaddr_port(g_svr_cfg[i].ip_port, addr, &len)) {
                log_error(LOG_ERR, "Invalid IP:port pair for upstream DNS server: %s", g_svr_cfg[i].ip_port);
                rc = false;
            }
            if (g_svr_cfg[i].addr.ss_family == AF_INET && ((struct sockaddr_in*)addr)->sin_port == 0)
                ((struct sockaddr_in*)addr)->sin_port = htons(DNS_DEFAULT_PORT);
            else if (g_svr_cfg[i].addr.ss_family == AF_INET6 && ((struct sockaddr_in6*)addr)->sin6_port == 0)
                ((struct sockaddr_in6*)addr)->sin6_port = htons(DNS_DEFAULT_PORT);
        }
        else {
            log_error(LOG_ERR, "IP:port pair is required");
            rc = false;   
        }
    }
    return rc;
}